

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

int AF_DBlockThingsIterator_Create
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  DBlockThingsIterator *this;
  char *pcVar4;
  AActor *origin;
  bool bVar5;
  double local_38;
  PClass *pPVar3;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_0041cfc5;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0041cfb5:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_0041cfc5;
  }
  origin = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_0041ce66;
LAB_0041ce7a:
    pPVar1 = AActor::RegistrationInfo.MyClass;
    pPVar3 = (origin->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (origin->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar5 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar5) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar5) {
      pcVar4 = "origin == NULL || origin->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_0041cfc5:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                    ,0x4b8,
                    "int AF_DBlockThingsIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_0041cfb5;
LAB_0041ce66:
    NullParam("\"origin\"");
    origin = (AActor *)(param->field_0).field_1.a;
    if (origin != (AActor *)0x0) goto LAB_0041ce7a;
    origin = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_0041d02b:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                    ,0x4b9,
                    "int AF_DBlockThingsIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_38 = param[1].field_0.f;
  }
  else {
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar4 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_0041d02b;
    }
    local_38 = param[1].field_0.f;
    if (2 < numparam) {
      if (param[2].field_0.field_3.Type != '\0') {
        pcVar4 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_0041cfe4;
      }
      goto LAB_0041cf4a;
    }
    param = defaultparam->Array;
  }
  if (param[2].field_0.field_3.Type != '\0') {
    pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0041cfe4:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x4ba,
                  "int AF_DBlockThingsIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_0041cf4a:
  iVar2 = param[2].field_0.i;
  this = (DBlockThingsIterator *)
         M_Malloc_Dbg(0x218,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                      ,0x1f9);
  DBlockThingsIterator::DBlockThingsIterator(this,origin,local_38,iVar2 != 0);
  if (numret < 1) {
    iVar2 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                    ,0x4bb,
                    "int AF_DBlockThingsIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar2 = 1;
    VMReturn::SetPointer(ret,this,1);
  }
  return iVar2;
}

Assistant:

DEFINE_ACTION_FUNCTION(DBlockThingsIterator, Create)
{
	PARAM_PROLOGUE;
	PARAM_OBJECT_NOT_NULL(origin, AActor);
	PARAM_FLOAT_DEF(radius);
	PARAM_BOOL_DEF(ignore);
	ACTION_RETURN_OBJECT(new DBlockThingsIterator(origin, radius, ignore));
}